

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ErrorFinish(sqlite3 *db,int err_code)

{
  int err_code_local;
  sqlite3 *db_local;
  
  if (db->pErr != (sqlite3_value *)0x0) {
    sqlite3ValueSetNull(db->pErr);
  }
  sqlite3SystemError(db,err_code);
  return;
}

Assistant:

static SQLITE_NOINLINE void  sqlite3ErrorFinish(sqlite3 *db, int err_code){
  if( db->pErr ) sqlite3ValueSetNull(db->pErr);
  sqlite3SystemError(db, err_code);
}